

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O1

int write_fcsr(CPURISCVState_conflict2 *env,int csrno,target_ulong val)

{
  byte *pbVar1;
  _Bool _Var2;
  
  if ((env->debugger == false) &&
     (_Var2 = riscv_cpu_fp_enabled_riscv64((CPURISCVState_conflict1 *)env), !_Var2)) {
    return -1;
  }
  pbVar1 = (byte *)((long)&env->mstatus + 1);
  *pbVar1 = *pbVar1 | 0x60;
  env->frm = (ulong)((uint)(val >> 5) & 7);
  riscv_cpu_set_fflags_riscv64(env,(ulong)((uint)val & 0x1f));
  return 0;
}

Assistant:

static int write_fcsr(CPURISCVState *env, int csrno, target_ulong val)
{
    if (!env->debugger && !riscv_cpu_fp_enabled(env)) {
        return -1;
    }
    env->mstatus |= MSTATUS_FS;
    env->frm = (val & FSR_RD) >> FSR_RD_SHIFT;
    riscv_cpu_set_fflags(env, (val & FSR_AEXC) >> FSR_AEXC_SHIFT);
    return 0;
}